

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,int marcha,string *dxout)

{
  ostream *poVar1;
  void *pvVar2;
  TPZAnalysis *in_RCX;
  long in_RDX;
  int in_ESI;
  TPZAnalysis *in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  REAL normsol;
  int iter;
  TPZCompMesh *anmesh;
  TPZMaterialT<double> *mat;
  string *in_stack_00000860;
  int in_stack_0000086c;
  TPZLinearAnalysis *in_stack_00000870;
  TPZMaterial *in_stack_00000878;
  int in_stack_00000884;
  REAL in_stack_00000888;
  TPZNonLinMultGridAnalysis *in_stack_00000890;
  TPZSolutionMatrix *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  long *local_a0;
  double local_88;
  TPZMaterial *in_stack_ffffffffffffff90;
  TPZCompMesh *in_stack_ffffffffffffff98;
  TPZNonLinMultGridAnalysis *in_stack_ffffffffffffffa0;
  int local_4c;
  
  if (in_RDX == 0) {
    local_a0 = (long *)0x0;
  }
  else {
    local_a0 = (long *)__dynamic_cast(in_RDX,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,
                                      0);
  }
  if (in_ESI < 1) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_1874ef4);
    TPZAnalysis::Solution(in_RCX);
    TPZSolutionMatrix::Zero(in_stack_ffffffffffffff38);
  }
  else if (in_R8D == 0) {
    TPZAnalysis::Mesh(in_RCX);
    std::operator<<((ostream *)&std::cout,
                    "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n");
    TPZAnalysis::Solution(in_RCX);
    TPZSolutionMatrix::Zero(in_stack_ffffffffffffff38);
    SetDeltaTime(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xb])(in_RCX,&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ");
    local_4c = 1;
    pvVar2 = (void *)std::ostream::operator<<(poVar1,1);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xc])();
    std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::function
              ((function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    (**(code **)(*local_a0 + 0xa0))(local_a0,&stack0xffffffffffffff90,0xffffffff);
    std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::~function
              ((function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)0x1c4cdfc);
    TPZAnalysis::Solution(in_RDI);
    local_88 = ::Norm(in_stack_ffffffffffffff38);
    while (local_4c < in_ESI && local_88 < in_XMM0_Qa) {
      TPZAnalysis::Solution(in_RCX);
      TPZSolutionMatrix::Zero(in_stack_ffffffffffffff38);
      SetDeltaTime(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xb])(in_RCX,&std::cout);
      (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xc])();
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ");
      local_4c = local_4c + 1;
      pvVar2 = (void *)std::ostream::operator<<(poVar1,local_4c);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      TPZAnalysis::Solution(in_RDI);
      local_88 = ::Norm(in_stack_ffffffffffffff38);
    }
    if (local_4c < in_ESI) {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
                              );
      poVar1 = std::operator<<(poVar1," due the great norm of the solution, norm solution = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,local_88);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
    (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xc])();
  }
  else {
    SmoothingSolution2(in_stack_00000890,in_stack_00000888,in_stack_00000884,in_stack_00000878,
                       in_stack_00000870,in_stack_0000086c,in_stack_00000860);
  }
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,
												  TPZLinearAnalysis &an,int marcha,const std::string &dxout) {
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	if(numiter <= 0){
		cout << "PZAnalysis::SmoothingSolution NENHUMA RESOLU�O EFETUADA\n";
		an.Solution().Zero();
		return;
	}
	if(marcha){
		//saida com o DX
		SmoothingSolution2(tol,numiter,mat,an,marcha,dxout);
		return;
	}
	TPZCompMesh *anmesh = an.Mesh();
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n";
	int iter = 0;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
}